

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O0

void __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
          (LLVMDependenceGraphBuilder *this,Module *M,LLVMDependenceGraphOptions *opts)

{
  bool bVar1;
  ControlFlowGraph *this_00;
  DGLLVMPointerAnalysis *pDVar2;
  undefined8 uVar3;
  LLVMDataDependenceAnalysis *in_RSI;
  undefined8 *in_RDI;
  StringRef SVar4;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  LLVMDependenceGraphOptions *in_stack_fffffffffffffe60;
  LLVMDataDependenceAnalysisOptions *in_stack_fffffffffffffe68;
  LLVMPointerAnalysis *in_stack_fffffffffffffe70;
  Module *m;
  LLVMDataDependenceAnalysis *this_01;
  size_t local_128;
  LLVMDependenceGraphBuilder *in_stack_fffffffffffffee0;
  
  *in_RDI = in_RSI;
  LLVMDependenceGraphOptions::LLVMDependenceGraphOptions
            (in_stack_fffffffffffffe60,
             (LLVMDependenceGraphOptions *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  m = (Module *)(in_RDI + 0x34);
  createPTA(in_stack_fffffffffffffee0);
  std::unique_ptr<dg::LLVMPointerAnalysis,std::default_delete<dg::LLVMPointerAnalysis>>::
  unique_ptr<std::default_delete<dg::LLVMPointerAnalysis>,void>
            ((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> *)
             in_stack_fffffffffffffe60,
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  operator_new(0xc0);
  this_01 = in_RSI;
  std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::get
            ((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> *)
             0x18a55a);
  LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
            ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffffe60,
             (LLVMDataDependenceAnalysisOptions *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
            (this_01,m,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::
  unique_ptr<dg::dda::LLVMDataDependenceAnalysis,std::default_delete<dg::dda::LLVMDataDependenceAnalysis>>
  ::unique_ptr<std::default_delete<dg::dda::LLVMDataDependenceAnalysis>,void>
            ((unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
              *)in_stack_fffffffffffffe60,
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions
            ((LLVMDataDependenceAnalysisOptions *)in_stack_fffffffffffffe60);
  operator_new(0x78);
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            ((LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffffe60,
             (LLVMControlDependenceAnalysisOptions *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            ((LLVMControlDependenceAnalysis *)this_01,m,
             (LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffffe70,
             (LLVMPointerAnalysis *)in_stack_fffffffffffffe68);
  std::
  unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>
  ::unique_ptr<std::default_delete<dg::LLVMControlDependenceAnalysis>,void>
            ((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              *)in_stack_fffffffffffffe60,
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions
            ((LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffffe60);
  operator_new(0x158);
  LLVMDependenceGraph::LLVMDependenceGraph
            ((LLVMDependenceGraph *)in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  std::unique_ptr<dg::LLVMDependenceGraph,std::default_delete<dg::LLVMDependenceGraph>>::
  unique_ptr<std::default_delete<dg::LLVMDependenceGraph>,void>
            ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
             in_stack_fffffffffffffe60,
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  if (((*(byte *)((long)in_RDI + 0x179) & 1) != 0) &&
     (bVar1 = LLVMPointerAnalysisOptions::isSVF((LLVMPointerAnalysisOptions *)(in_RDI + 1)), !bVar1)
     ) {
    this_00 = (ControlFlowGraph *)operator_new(0x18);
    pDVar2 = (DGLLVMPointerAnalysis *)
             std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
             ::get((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                    *)0x18a6c9);
    ControlFlowGraph::ControlFlowGraph(this_00,pDVar2);
  }
  std::unique_ptr<ControlFlowGraph,std::default_delete<ControlFlowGraph>>::
  unique_ptr<std::default_delete<ControlFlowGraph>,void>
            ((unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_> *)
             in_stack_fffffffffffffe60,
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  llvm::StringRef::StringRef
            ((StringRef *)in_RSI,
             (string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  SVar4.Length = local_128;
  SVar4.Data = (char *)in_RSI;
  uVar3 = llvm::Module::getFunction(SVar4);
  in_RDI[0x39] = uVar3;
  Statistics::Statistics((Statistics *)(in_RDI + 0x3a));
  return;
}

Assistant:

LLVMDependenceGraphBuilder(llvm::Module *M,
                               const LLVMDependenceGraphOptions &opts)
            : _M(M), _options(opts), _PTA(createPTA()),
              _DDA(new LLVMDataDependenceAnalysis(M, _PTA.get(),
                                                  _options.DDAOptions)),
              _CDA(new LLVMControlDependenceAnalysis(M, _options.CDAOptions)),
              _dg(new LLVMDependenceGraph(opts.threads)),
              _controlFlowGraph(
                      _options.threads && !_options.PTAOptions.isSVF()
                              ? // check SVF due to the static cast...
                              new ControlFlowGraph(
                                      static_cast<DGLLVMPointerAnalysis *>(
                                              _PTA.get()))
                              : nullptr),
              _entryFunction(M->getFunction(_options.entryFunction)) {
        assert(_entryFunction && "The entry function not found");
    }